

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O0

void __thiscall
OpenMD::Communicator<(OpenMD::communicatorType)2>::Communicator
          (Communicator<(OpenMD::communicatorType)2> *this)

{
  int *in_RDI;
  double dVar1;
  int i;
  int nColumns;
  int nColumnsMax;
  int myRank;
  int nProc;
  int local_1c;
  int local_18;
  int local_10;
  int local_c [3];
  
  MPI_Comm_size(&ompi_mpi_comm_world,local_c);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_10);
  dVar1 = sqrt((double)local_c[0]);
  local_18 = 0;
  for (local_1c = 1; local_1c < (int)dVar1 + 1; local_1c = local_1c + 1) {
    if (local_c[0] % local_1c == 0) {
      local_18 = local_1c;
    }
  }
  *in_RDI = local_10 / local_18;
  in_RDI[1] = local_10 % local_18;
  MPI_Comm_split(&ompi_mpi_comm_world,in_RDI[1],0,in_RDI + 2);
  return;
}

Assistant:

Communicator<D>() {
      int nProc;
      int myRank;

      MPI_Comm_size(MPI_COMM_WORLD, &nProc);
      MPI_Comm_rank(MPI_COMM_WORLD, &myRank);

      int nColumnsMax = (int)sqrt(RealType(nProc));

      int nColumns(0);
      for (int i = 1; i < nColumnsMax + 1; i++) {
        if (nProc % i == 0) nColumns = i;
      }

      // int nRows = nProc / nColumns;
      rowIndex_    = myRank / nColumns;
      columnIndex_ = myRank % nColumns;

      switch (D) {
      case Row:
        MPI_Comm_split(MPI_COMM_WORLD, rowIndex_, 0, &myComm);
        break;
      case Column:
        MPI_Comm_split(MPI_COMM_WORLD, columnIndex_, 0, &myComm);
        break;
      case Global:
        MPI_Comm_split(MPI_COMM_WORLD, myRank, 0, &myComm);
      }
    }